

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fortran.c
# Opt level: O2

REF_STATUS
ref_fortran_import_face_(REF_INT *face_index,REF_INT *node_per_face,REF_INT *nface,REF_INT *f2n)

{
  int iVar1;
  REF_NODE pRVar2;
  bool bVar3;
  REF_GRID_conflict pRVar4;
  uint uVar5;
  REF_INT *nodes;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  int iVar9;
  bool bVar10;
  undefined8 uStack_60;
  REF_CELL ref_cell;
  REF_INT new_face;
  
  pRVar2 = ref_grid->node;
  uVar5 = ref_grid_face_with(ref_grid,*node_per_face,&ref_cell);
  if (uVar5 == 0) {
    if (*node_per_face < -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",
             0x65,"ref_fortran_import_face_","malloc nodes of REF_INT negative");
      uVar5 = 1;
    }
    else {
      nodes = (REF_INT *)malloc((ulong)(*node_per_face + 1) << 2);
      if (nodes == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",
               0x65,"ref_fortran_import_face_","malloc nodes of REF_INT NULL");
        uVar5 = 2;
      }
      else {
        for (iVar9 = 0; pRVar4 = ref_grid, iVar9 < *nface; iVar9 = iVar9 + 1) {
          uVar5 = *node_per_face;
          uVar6 = 0;
          uVar7 = 0;
          if (0 < (int)uVar5) {
            uVar7 = (ulong)uVar5;
          }
          bVar10 = false;
          for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
            iVar1 = f2n[(long)(int)(uVar5 * iVar9) + uVar6];
            nodes[uVar6] = iVar1 + -1;
            bVar3 = !bVar10;
            bVar10 = true;
            if (bVar3) {
              bVar10 = pRVar4->mpi->id == pRVar2->part[(long)iVar1 + -1];
            }
          }
          nodes[(int)uVar5] = *face_index;
          if ((bVar10) && (uVar5 = ref_cell_add(ref_cell,nodes,&new_face), uVar5 != 0)) {
            pcVar8 = "add face";
            uStack_60 = 0x71;
            goto LAB_0010dff5;
          }
        }
        free(nodes);
        uVar5 = 0;
      }
    }
  }
  else {
    pcVar8 = "get face";
    uStack_60 = 99;
LAB_0010dff5:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",
           uStack_60,"ref_fortran_import_face_",(ulong)uVar5,pcVar8);
  }
  return uVar5;
}

Assistant:

REF_STATUS REF_FORT_(ref_fortran_import_face,
                     REF_FORTRAN_IMPORT_FACE)(REF_INT *face_index,
                                              REF_INT *node_per_face,
                                              REF_INT *nface, REF_INT *f2n) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT *nodes;
  REF_CELL ref_cell;
  REF_INT face, node, new_face;
  REF_BOOL has_a_local_node;

  RSS(ref_grid_face_with(ref_grid, *node_per_face, &ref_cell), "get face");

  ref_malloc(nodes, (*node_per_face) + 1, REF_INT);
  RNS(nodes, "malloc nodes NULL");
  for (face = 0; face < (*nface); face++) {
    has_a_local_node = REF_FALSE;
    for (node = 0; node < (*node_per_face); node++) {
      nodes[node] = f2n[node + (*node_per_face) * face] - 1;
      has_a_local_node =
          has_a_local_node || (ref_mpi_rank(ref_grid_mpi(ref_grid)) ==
                               ref_node_part(ref_node, nodes[node]));
    }
    nodes[(*node_per_face)] = (*face_index);
    if (has_a_local_node)
      RSS(ref_cell_add(ref_cell, nodes, &new_face), "add face");
  }
  free(nodes);
  return REF_SUCCESS;
}